

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode curl_mime_encoder(curl_mimepart *part,char *encoding)

{
  int iVar1;
  mime_encoder *local_30;
  mime_encoder *mep;
  CURLcode result;
  char *encoding_local;
  curl_mimepart *part_local;
  
  mep._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  if (part == (curl_mimepart *)0x0) {
    part_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    part->encoder = (mime_encoder *)0x0;
    if (encoding == (char *)0x0) {
      part_local._4_4_ = CURLE_OK;
    }
    else {
      for (local_30 = encoders; local_30->name != (char *)0x0; local_30 = local_30 + 1) {
        iVar1 = Curl_strcasecompare(encoding,local_30->name);
        if (iVar1 != 0) {
          part->encoder = local_30;
          mep._4_4_ = CURLE_OK;
        }
      }
      part_local._4_4_ = mep._4_4_;
    }
  }
  return part_local._4_4_;
}

Assistant:

CURLcode curl_mime_encoder(curl_mimepart *part, const char *encoding)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
  const struct mime_encoder *mep;

  if(!part)
    return result;

  part->encoder = NULL;

  if(!encoding)
    return CURLE_OK;    /* Removing current encoder. */

  for(mep = encoders; mep->name; mep++)
    if(strcasecompare(encoding, mep->name)) {
      part->encoder = mep;
      result = CURLE_OK;
    }

  return result;
}